

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall libtorrent::torrent_added_alert::~torrent_added_alert(torrent_added_alert *this)

{
  torrent_added_alert *this_local;
  
  torrent_alert::~torrent_alert(&this->super_torrent_alert);
  return;
}

Assistant:

struct TORRENT_DEPRECATED_EXPORT torrent_added_alert final : torrent_alert
	{
		// internal
		torrent_added_alert(aux::stack_allocator& alloc, torrent_handle const& h);

		TORRENT_DEFINE_ALERT(torrent_added_alert, 3)
		static constexpr alert_category_t static_category = alert_category::status;
		std::string message() const override;
	}